

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> __thiscall
iDynTree::optimalcontrol::integrators::Integrator::dynamicalSystem(Integrator *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> wVar1;
  
  std::__weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,void>
            ((__weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,(__gnu_cxx::_Lock_policy)2> *)
             this,(__shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   *)(in_RSI + 0x10));
  wVar1.super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  wVar1.super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (weak_ptr<iDynTree::optimalcontrol::DynamicalSystem>)
         wVar1.
         super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const std::weak_ptr<DynamicalSystem> Integrator::dynamicalSystem() const{
                return m_dynamicalSystem_ptr;
            }